

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::NetStrengthSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != ChargeStrength) && (kind != DriveStrength)) && (kind != PullStrength)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool NetStrengthSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ChargeStrength:
        case SyntaxKind::DriveStrength:
        case SyntaxKind::PullStrength:
            return true;
        default:
            return false;
    }
}